

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall helics::CommsInterface::logMessage(CommsInterface *this,string_view message)

{
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  char *in_RDI;
  int in_stack_ffffffffffffff6c;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  _Alloc_hider in_stack_ffffffffffffffb8;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)0x4cd1b8);
  if (bVar1) {
    pcVar2 = in_RDI + 0x298;
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffffb8;
    std::operator+(in_stack_ffffffffffffffb8._M_p,in_stack_ffffffffffffffb0);
    std::__cxx11::string::operator_cast_to_basic_string_view(this_01);
    __args_1._M_str = in_stack_ffffffffffffff90;
    __args_1._M_len = in_stack_ffffffffffffff88;
    __args_2._M_str = in_RDI;
    __args_2._M_len = (size_t)pcVar2;
    std::
    function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)this_01,in_stack_ffffffffffffff6c,__args_1,__args_2);
    std::__cxx11::string::~string(this_01);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"commMessage||");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0xd0));
    std::operator<<(poVar3,":");
    __str._M_str = in_RDI;
    __str._M_len = in_stack_ffffffffffffff78;
    this_00 = std::operator<<(in_stack_ffffffffffffff70,__str);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void CommsInterface::logMessage(std::string_view message) const
{
    if (loggingCallback) {
        loggingCallback(HELICS_LOG_LEVEL_INTERFACES, "commMessage||" + name, message);
    } else {
        std::cout << "commMessage||" << name << ":" << message << std::endl;
    }
}